

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

unsigned_long_long ZSTD_decompressBound(void *src,size_t srcSize)

{
  ulong uVar1;
  unsigned_long_long uVar2;
  unsigned_long_long uVar3;
  bool bVar4;
  ZSTD_frameSizeInfo ZVar5;
  
  uVar3 = 0;
  do {
    if (srcSize == 0) {
      return uVar3;
    }
    ZVar5 = ZSTD_findFrameSizeInfo(src,srcSize);
    uVar2 = ZVar5.decompressedBound;
    uVar1 = ZVar5.compressedSize;
    if (uVar2 != 0xfffffffffffffffe && uVar1 < 0xffffffffffffff89) {
      bVar4 = srcSize < uVar1;
      srcSize = srcSize - uVar1;
      if (bVar4) {
        __assert_fail("srcSize >= compressedSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x5bc9,"unsigned long long ZSTD_decompressBound(const void *, size_t)");
      }
      src = (void *)((long)src + uVar1);
      uVar3 = uVar3 + uVar2;
    }
  } while (uVar2 != 0xfffffffffffffffe && uVar1 < 0xffffffffffffff89);
  return 0xfffffffffffffffe;
}

Assistant:

unsigned long long ZSTD_decompressBound(const void* src, size_t srcSize)
{
    unsigned long long bound = 0;
    /* Iterate over each frame */
    while (srcSize > 0) {
        ZSTD_frameSizeInfo const frameSizeInfo = ZSTD_findFrameSizeInfo(src, srcSize);
        size_t const compressedSize = frameSizeInfo.compressedSize;
        unsigned long long const decompressedBound = frameSizeInfo.decompressedBound;
        if (ZSTD_isError(compressedSize) || decompressedBound == ZSTD_CONTENTSIZE_ERROR)
            return ZSTD_CONTENTSIZE_ERROR;
        assert(srcSize >= compressedSize);
        src = (const BYTE*)src + compressedSize;
        srcSize -= compressedSize;
        bound += decompressedBound;
    }
    return bound;
}